

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O0

size_t __thiscall proto3::TestMessage::ByteSizeLong(TestMessage *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  EnumType EVar7;
  size_t sVar8;
  RepeatedField<int> *pRVar9;
  size_t sVar10;
  RepeatedField<long> *value;
  size_t sVar11;
  RepeatedField<unsigned_int> *value_00;
  size_t sVar12;
  RepeatedField<unsigned_long> *value_01;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar17;
  const_reference pbVar18;
  RepeatedPtrField<proto3::MessageType> *this_00;
  uint32_t *puVar19;
  ulong uVar20;
  string *psVar21;
  int64_t iVar22;
  uint64_t uVar23;
  unsigned_long uVar24;
  long local_e8;
  long local_e0;
  long local_d8;
  double local_d0;
  float local_c4;
  reference local_c0;
  MessageType *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto3::MessageType> *__range2;
  int n_1;
  int i_1;
  int n;
  int i;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMessage *this_;
  TestMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_repeated_bool_value_size(this);
  sVar8 = google::protobuf::internal::FromIntSize(iVar3);
  if (sVar8 == 0) {
    local_d8 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar8);
    local_d8 = sVar10 + 2;
  }
  pRVar9 = _internal_repeated_int32_value(this);
  sVar10 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (pRVar9,2,&(this->field_0)._impl_._repeated_int32_value_cached_byte_size_);
  value = _internal_repeated_int64_value(this);
  sVar11 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                     (value,2,&(this->field_0)._impl_._repeated_int64_value_cached_byte_size_);
  value_00 = _internal_repeated_uint32_value(this);
  sVar12 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (value_00,2,&(this->field_0)._impl_._repeated_uint32_value_cached_byte_size_);
  value_01 = _internal_repeated_uint64_value(this);
  sVar13 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (value_01,2,&(this->field_0)._impl_._repeated_uint64_value_cached_byte_size_);
  iVar3 = _internal_repeated_float_value_size(this);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  lVar15 = sVar14 * 4;
  if (lVar15 == 0) {
    local_e0 = 0;
  }
  else {
    sVar14 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar15);
    local_e0 = sVar14 + 2;
  }
  iVar3 = _internal_repeated_double_value_size(this);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  lVar16 = sVar14 * 8;
  if (lVar16 == 0) {
    local_e8 = 0;
  }
  else {
    sVar14 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar16);
    local_e8 = sVar14 + 2;
  }
  pRVar17 = _internal_repeated_string_value_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar17);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar14 * 2 +
              local_e8 + lVar16 +
              local_e0 + lVar15 + sVar13 + sVar12 + sVar11 + sVar10 + local_d8 + sVar8;
  i_1 = 0;
  pRVar17 = _internal_repeated_string_value_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar17);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    pRVar17 = _internal_repeated_string_value_abi_cxx11_(this);
    pbVar18 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar17,i_1);
    sVar8 = google::protobuf::internal::WireFormatLite::StringSize(pbVar18);
    sStack_58 = sVar8 + sStack_58;
  }
  pRVar17 = _internal_repeated_bytes_value_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar17);
  sVar8 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar8 * 2 + sStack_58;
  __range2._4_4_ = 0;
  pRVar17 = _internal_repeated_bytes_value_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar17);
  for (; __range2._4_4_ < iVar3; __range2._4_4_ = __range2._4_4_ + 1) {
    pRVar17 = _internal_repeated_bytes_value_abi_cxx11_(this);
    pbVar18 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar17,__range2._4_4_);
    sVar8 = google::protobuf::internal::WireFormatLite::BytesSize(pbVar18);
    sStack_58 = sVar8 + sStack_58;
  }
  pRVar9 = _internal_repeated_enum_value(this);
  sVar8 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (pRVar9,2,&(this->field_0)._impl_._repeated_enum_value_cached_byte_size_);
  iVar3 = _internal_repeated_message_value_size(this);
  sStack_58 = (long)iVar3 * 2 + sVar8 + sStack_58;
  this_00 = _internal_repeated_message_value(this);
  __end2 = google::protobuf::RepeatedPtrField<proto3::MessageType>::begin(this_00);
  msg = (MessageType *)google::protobuf::RepeatedPtrField<proto3::MessageType>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    local_c0 = google::protobuf::internal::RepeatedPtrIterator<const_proto3::MessageType>::operator*
                         (&__end2);
    sVar8 = google::protobuf::internal::WireFormatLite::MessageSize<proto3::MessageType>(local_c0);
    sStack_58 = sVar8 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto3::MessageType>::operator++(&__end2);
  }
  puVar19 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar19;
  sStack_58 = (long)(int)((uint)((uVar1 & 0x8000) != 0) * 3) +
              (long)(int)((uint)((uVar1 & 0x100000) != 0) * 6) +
              (long)(int)((uint)((uVar1 & 0x200000) != 0) * 10) + sStack_58;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_string_value_abi_cxx11_(this);
      uVar20 = std::__cxx11::string::empty();
      if ((uVar20 & 1) == 0) {
        psVar21 = _internal_string_value_abi_cxx11_(this);
        sVar8 = google::protobuf::internal::WireFormatLite::StringSize(psVar21);
        sStack_58 = sVar8 + 1 + sStack_58;
      }
    }
    if ((uVar1 & 2) != 0) {
      _internal_bytes_value_abi_cxx11_(this);
      uVar20 = std::__cxx11::string::empty();
      if ((uVar20 & 1) == 0) {
        psVar21 = _internal_bytes_value_abi_cxx11_(this);
        sVar8 = google::protobuf::internal::WireFormatLite::BytesSize(psVar21);
        sStack_58 = sVar8 + 1 + sStack_58;
      }
    }
    if ((uVar1 & 4) != 0) {
      psVar21 = _internal_optional_string_value_abi_cxx11_(this);
      sVar8 = google::protobuf::internal::WireFormatLite::StringSize(psVar21);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      psVar21 = _internal_optional_bytes_value_abi_cxx11_(this);
      sVar8 = google::protobuf::internal::WireFormatLite::BytesSize(psVar21);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar8 = google::protobuf::internal::WireFormatLite::MessageSize<proto3::MessageType>
                        ((this->field_0)._impl_.message_value_);
      sStack_58 = sVar8 + 1 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar8 = google::protobuf::internal::WireFormatLite::MessageSize<proto3::MessageType>
                        ((this->field_0)._impl_.optional_message_value_);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if (((uVar1 & 0x40) != 0) && (bVar2 = _internal_bool_value(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x80) != 0) && (iVar4 = _internal_int32_value(this), iVar4 != 0)) {
      iVar4 = _internal_int32_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar8 + sStack_58;
    }
  }
  if ((uVar1 & 0x7f00) != 0) {
    if (((uVar1 & 0x100) != 0) && (iVar22 = _internal_int64_value(this), iVar22 != 0)) {
      iVar22 = _internal_int64_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar22);
      sStack_58 = sVar8 + sStack_58;
    }
    if (((uVar1 & 0x200) != 0) && (uVar23 = _internal_uint64_value(this), uVar23 != 0)) {
      uVar23 = _internal_uint64_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar23);
      sStack_58 = sVar8 + sStack_58;
    }
    if (((uVar1 & 0x400) != 0) && (uVar5 = _internal_uint32_value(this), uVar5 != 0)) {
      uVar5 = _internal_uint32_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar5);
      sStack_58 = sVar8 + sStack_58;
    }
    if ((uVar1 & 0x800) != 0) {
      local_c4 = _internal_float_value(this);
      uVar6 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(&local_c4);
      if (uVar6 != 0) {
        sStack_58 = sStack_58 + 5;
      }
    }
    if ((uVar1 & 0x1000) != 0) {
      local_d0 = _internal_double_value(this);
      uVar24 = absl::lts_20250127::bit_cast<unsigned_long,_double,_0>(&local_d0);
      if (uVar24 != 0) {
        sStack_58 = sStack_58 + 9;
      }
    }
    if (((uVar1 & 0x2000) != 0) && (EVar7 = _internal_enum_value(this), EVar7 != FOO)) {
      EVar7 = _internal_enum_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::EnumSize(EVar7);
      sStack_58 = sVar8 + 1 + sStack_58;
    }
    if ((uVar1 & 0x4000) != 0) {
      EVar7 = _internal_optional_enum_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::EnumSize(EVar7);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xf0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      iVar4 = _internal_optional_int32_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20000) != 0) {
      iVar22 = _internal_optional_int64_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::Int64Size(iVar22);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40000) != 0) {
      uVar23 = _internal_optional_uint64_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar23);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80000) != 0) {
      uVar5 = _internal_optional_uint32_value(this);
      sVar8 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar5);
      sStack_58 = sVar8 + 2 + sStack_58;
    }
  }
  sVar8 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar8;
}

Assistant:

::size_t TestMessage::ByteSizeLong() const {
  const TestMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.TestMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated bool repeated_bool_value = 21;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated int32 repeated_int32_value = 22;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_value(), 2,
              this_._impl_._repeated_int32_value_cached_byte_size_);
    }
    // repeated int64 repeated_int64_value = 23;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64_value(), 2,
              this_._impl_._repeated_int64_value_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32_value = 24;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32_value(), 2,
              this_._impl_._repeated_uint32_value_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64_value = 25;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64_value(), 2,
              this_._impl_._repeated_uint64_value_cached_byte_size_);
    }
    // repeated float repeated_float_value = 26;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double_value = 27;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string_value = 28;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_value().size());
      for (int i = 0, n = this_._internal_repeated_string_value().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_value().Get(i));
      }
    }
    // repeated bytes repeated_bytes_value = 29;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes_value().size());
      for (int i = 0, n = this_._internal_repeated_bytes_value().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes_value().Get(i));
      }
    }
    // repeated .proto3.EnumType repeated_enum_value = 30;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_enum_value(), 2, this_._impl_._repeated_enum_value_cached_byte_size_);
    }
    // repeated .proto3.MessageType repeated_message_value = 31;
    {
      total_size += 2UL * this_._internal_repeated_message_value_size();
      for (const auto& msg : this_._internal_repeated_message_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00200000u & cached_has_bits) * 10;
  total_size += static_cast<bool>(0x00100000u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00008000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string string_value = 8;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_string_value().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_string_value());
      }
    }
    // bytes bytes_value = 9;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!this_._internal_bytes_value().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                        this_._internal_bytes_value());
      }
    }
    // optional string optional_string_value = 48;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_value());
    }
    // optional bytes optional_bytes_value = 49;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes_value());
    }
    // .proto3.MessageType message_value = 11;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_value_);
    }
    // optional .proto3.MessageType optional_message_value = 51;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_message_value_);
    }
    // bool bool_value = 1;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_bool_value() != 0) {
        total_size += 2;
      }
    }
    // int32 int32_value = 2;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_int32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_int32_value());
      }
    }
  }
  if ((cached_has_bits & 0x00007f00u) != 0) {
    // int64 int64_value = 3;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_int64_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
            this_._internal_int64_value());
      }
    }
    // uint64 uint64_value = 5;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_uint64_value() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
            this_._internal_uint64_value());
      }
    }
    // uint32 uint32_value = 4;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_uint32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
            this_._internal_uint32_value());
      }
    }
    // float float_value = 6;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_float_value()) != 0) {
        total_size += 5;
      }
    }
    // double double_value = 7;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(this_._internal_double_value()) != 0) {
        total_size += 9;
      }
    }
    // .proto3.EnumType enum_value = 10;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_enum_value() != 0) {
        total_size += 1 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_value());
      }
    }
    // optional .proto3.EnumType optional_enum_value = 50;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_enum_value());
    }
  }
  if ((cached_has_bits & 0x000f0000u) != 0) {
    // optional int32 optional_int32_value = 42;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_value());
    }
    // optional int64 optional_int64_value = 43;
    if ((cached_has_bits & 0x00020000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_optional_int64_value());
    }
    // optional uint64 optional_uint64_value = 45;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_optional_uint64_value());
    }
    // optional uint32 optional_uint32_value = 44;
    if ((cached_has_bits & 0x00080000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_value());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}